

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool prvTidyTextNodeEndWithSpace(Lexer *lexer,Node *node)

{
  Bool BVar1;
  uint uVar2;
  uint local_28;
  uint local_24;
  uint c;
  uint i;
  Node *node_local;
  Lexer *lexer_local;
  
  _c = node;
  node_local = (Node *)lexer;
  BVar1 = prvTidynodeIsText(node);
  if ((BVar1 != no) && (_c->start < _c->end)) {
    local_28 = 0;
    for (local_24 = _c->start; local_24 < _c->end; local_24 = local_24 + 1) {
      local_28 = (uint)*(byte *)((long)&(node_local[1].parent)->parent + (ulong)local_24);
      if (0x7f < local_28) {
        uVar2 = prvTidyGetUTF8((ctmbstr)((long)&(node_local[1].parent)->parent + (ulong)local_24),
                               &local_28);
        local_24 = uVar2 + local_24;
      }
    }
    if ((local_28 == 0x20) || (local_28 == 10)) {
      return yes;
    }
  }
  return no;
}

Assistant:

Bool TY_(TextNodeEndWithSpace)( Lexer *lexer, Node *node )
{
    if (TY_(nodeIsText)(node) && node->end > node->start)
    {
        uint i, c = '\0'; /* initialised to avoid warnings */
        for (i = node->start; i < node->end; ++i)
        {
            c = (byte) lexer->lexbuf[i];
            if ( c > 0x7F )
                i += TY_(GetUTF8)( lexer->lexbuf + i, &c );
        }

        if ( c == ' ' || c == '\n' )
            return yes;
    }
    return no;
}